

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor.cpp
# Opt level: O0

void __thiscall Mond::Visitor::Visit(Visitor *this,StmtWhile *stmt)

{
  AstNode *pAVar1;
  StmtWhile *stmt_local;
  Visitor *this_local;
  
  VisitSelf<Mond::StmtWhile*>(this,stmt);
  pAVar1 = &std::__shared_ptr<Mond::Expr,_(__gnu_cxx::_Lock_policy)2>::get
                      (&(stmt->cond).super___shared_ptr<Mond::Expr,_(__gnu_cxx::_Lock_policy)2>)->
            super_AstNode;
  AcceptChild(this,pAVar1);
  pAVar1 = &std::__shared_ptr<Mond::Stmt,_(__gnu_cxx::_Lock_policy)2>::get
                      (&(stmt->body).super___shared_ptr<Mond::Stmt,_(__gnu_cxx::_Lock_policy)2>)->
            super_AstNode;
  AcceptChild(this,pAVar1);
  return;
}

Assistant:

void Visitor::Visit(StmtWhile *stmt)
{
	VisitSelf(this, stmt);
	AcceptChild(this, stmt->cond.get());
	AcceptChild(this, stmt->body.get());
}